

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O3

void __thiscall
slang::syntax::BinaryExpressionSyntax::BinaryExpressionSyntax
          (BinaryExpressionSyntax *this,SyntaxKind kind,ExpressionSyntax *left,Token operatorToken,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,ExpressionSyntax *right)

{
  size_type sVar1;
  pointer ppAVar2;
  SyntaxKind SVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  long lVar6;
  
  uVar5 = operatorToken._0_8_;
  (this->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_ExpressionSyntax).super_SyntaxNode.kind = kind;
  (this->left).ptr = left;
  (this->operatorToken).kind = (short)uVar5;
  (this->operatorToken).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->operatorToken).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->operatorToken).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->operatorToken).info = operatorToken.info;
  SVar3 = (attributes->super_SyntaxListBase).super_SyntaxNode.kind;
  uVar4 = *(undefined4 *)&(attributes->super_SyntaxListBase).super_SyntaxNode.field_0xc;
  (this->attributes).super_SyntaxListBase.super_SyntaxNode.parent =
       (attributes->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->attributes).super_SyntaxListBase.super_SyntaxNode.kind = SVar3;
  *(undefined4 *)&(this->attributes).super_SyntaxListBase.super_SyntaxNode.field_0xc = uVar4;
  (this->attributes).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00507f08;
  (this->attributes).super_SyntaxListBase.childCount = (attributes->super_SyntaxListBase).childCount
  ;
  sVar1 = (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
          .size_;
  (this->attributes).super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
  data_ = (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
          .data_;
  (this->attributes).super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
  size_ = sVar1;
  (this->attributes).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_00508348;
  (this->right).ptr = right;
  (left->super_SyntaxNode).parent = (SyntaxNode *)this;
  (this->attributes).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  sVar1 = (this->attributes).
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_;
  if (sVar1 != 0) {
    ppAVar2 = (this->attributes).
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_;
    lVar6 = 0;
    do {
      **(undefined8 **)((long)ppAVar2 + lVar6) = this;
      lVar6 = lVar6 + 8;
    } while (sVar1 << 3 != lVar6);
  }
  (right->super_SyntaxNode).parent = (SyntaxNode *)this;
  return;
}

Assistant:

BinaryExpressionSyntax(SyntaxKind kind, ExpressionSyntax& left, Token operatorToken, const SyntaxList<AttributeInstanceSyntax>& attributes, ExpressionSyntax& right) :
        ExpressionSyntax(kind), left(&left), operatorToken(operatorToken), attributes(attributes), right(&right) {
        this->left->parent = this;
        this->attributes.parent = this;
        for (auto child : this->attributes)
            child->parent = this;
        this->right->parent = this;
    }